

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendString(MinimalFormatter *this,char *str)

{
  char *pcVar1;
  ptrdiff_t i;
  
  i = 0;
  while( true ) {
    if ((str[i] == '\0') || (pcVar1 = this->cursor_ + i, this->end_ <= pcVar1)) break;
    *pcVar1 = str[i];
    i = i + 1;
  }
  this->cursor_ = this->cursor_ + i;
  return;
}

Assistant:

void AppendString(const char* str) {
    ptrdiff_t i = 0;
    while (str[i] != '\0' && cursor_ + i < end_) {
      cursor_[i] = str[i];
      ++i;
    }
    cursor_ += i;
  }